

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void iter_54(float *z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float y3;
  float y2;
  float y1;
  float y0;
  float k33;
  float k22;
  float k11;
  float k00;
  float *z_local;
  
  fVar1 = *z;
  fVar2 = z[-4];
  fVar3 = *z;
  fVar4 = z[-2];
  fVar5 = z[-6];
  *z = fVar3 + z[-4] + z[-2] + z[-6];
  z[-2] = (fVar3 + z[-4]) - (z[-2] + z[-6]);
  z[-4] = (fVar1 - fVar2) + (z[-3] - z[-7]);
  z[-6] = (fVar1 - fVar2) - (z[-3] - z[-7]);
  fVar1 = z[-1];
  fVar2 = z[-5];
  fVar3 = z[-1];
  z[-1] = fVar3 + z[-5] + z[-3] + z[-7];
  z[-3] = (fVar3 + z[-5]) - (z[-3] + z[-7]);
  z[-5] = (fVar1 - fVar2) - (fVar4 - fVar5);
  z[-7] = (fVar1 - fVar2) + (fVar4 - fVar5);
  return;
}

Assistant:

static __forceinline void iter_54(float *z)
{
   float k00,k11,k22,k33;
   float y0,y1,y2,y3;

   k00  = z[ 0] - z[-4];
   y0   = z[ 0] + z[-4];
   y2   = z[-2] + z[-6];
   k22  = z[-2] - z[-6];

   z[-0] = y0 + y2;      // z0 + z4 + z2 + z6
   z[-2] = y0 - y2;      // z0 + z4 - z2 - z6

   // done with y0,y2

   k33  = z[-3] - z[-7];

   z[-4] = k00 + k33;    // z0 - z4 + z3 - z7
   z[-6] = k00 - k33;    // z0 - z4 - z3 + z7

   // done with k33

   k11  = z[-1] - z[-5];
   y1   = z[-1] + z[-5];
   y3   = z[-3] + z[-7];

   z[-1] = y1 + y3;      // z1 + z5 + z3 + z7
   z[-3] = y1 - y3;      // z1 + z5 - z3 - z7
   z[-5] = k11 - k22;    // z1 - z5 + z2 - z6
   z[-7] = k11 + k22;    // z1 - z5 - z2 + z6
}